

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O0

void close_socket_to_container(libssh2_socket_t sock)

{
  libssh2_socket_t sock_local;
  
  if (sock != -1) {
    shutdown(sock,2);
    close(sock);
  }
  return;
}

Assistant:

static void close_socket_to_container(libssh2_socket_t sock)
{
    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2 /* SHUT_RDWR */);
#ifdef _WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }
}